

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  ZoneAllocator *allocator;
  size_type *psVar1;
  ZoneHashNode ZVar2;
  size_type sVar3;
  uint8_t *puVar4;
  long lVar5;
  Error EVar6;
  uint uVar7;
  int iVar8;
  Error EVar9;
  LabelEntry *pLVar10;
  ZoneHashNode *node;
  ulong uVar11;
  long lVar12;
  char *name;
  uint8_t *puVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  Zone *zone;
  ZoneAllocator *allocator_00;
  void *__s1;
  ZoneHashNode *this_00;
  int in_R8D;
  uint in_R9D;
  ulong uStack_68;
  size_t sStack_60;
  LabelEntry **ppLStack_58;
  size_t sStack_28;
  
  *entryOut = (LabelEntry *)0x0;
  sVar3 = (this->_labelEntries).super_ZoneVectorBase._size;
  if (sVar3 == 0xffffffff) {
    EVar6 = 0xd;
  }
  else {
    allocator_00 = &this->_allocator;
    EVar6 = 0;
    if ((this->_labelEntries).super_ZoneVectorBase._capacity == sVar3) {
      EVar6 = ZoneVectorBase::_grow(&(this->_labelEntries).super_ZoneVectorBase,allocator_00,8,1);
    }
    if (EVar6 == 0) {
      if (allocator_00->_zone == (Zone *)0x0) {
        newLabelEntry();
      }
      else {
        puVar15 = (undefined8 *)0x40;
        pLVar10 = (LabelEntry *)ZoneAllocator::_allocZeroed(allocator_00,0x40,&sStack_28);
        if (pLVar10 != (LabelEntry *)0x0) {
          *(size_type *)&pLVar10->field_0xc = sVar3;
          pLVar10->_parentId = 0xffffffff;
          pLVar10->_offset = 0;
          uVar7 = (this->_labelEntries).super_ZoneVectorBase._size;
          uVar11 = (ulong)uVar7;
          if (uVar7 < (this->_labelEntries).super_ZoneVectorBase._capacity) {
            *(LabelEntry **)((long)(this->_labelEntries).super_ZoneVectorBase._data + uVar11 * 8) =
                 pLVar10;
            psVar1 = &(this->_labelEntries).super_ZoneVectorBase._size;
            *psVar1 = *psVar1 + 1;
            *entryOut = pLVar10;
            return 0;
          }
          newLabelEntry();
          *puVar15 = 0;
          uStack_68 = uVar11;
          ppLStack_58 = entryOut;
          uVar7 = CodeHolder_hashNameAndGetSize(name,&uStack_68);
          uVar11 = uStack_68;
          if (uStack_68 == 0) {
            EVar6 = 0x11;
          }
          else if (uStack_68 < 0x801) {
            if (in_R8D - 2U < 2) {
              if (in_R9D != 0xffffffff) {
                return 0x13;
              }
            }
            else {
              if (in_R8D != 1) {
                return 2;
              }
              if (*(uint *)((long)(allocator_00 + 2) + 0x18) <= in_R9D) {
                return 0x12;
              }
              uVar7 = uVar7 ^ in_R9D;
            }
            for (puVar14 = *(undefined8 **)
                            (*(long *)((long)(allocator_00 + 2) + 0x30) +
                            (ulong)(uVar7 - (int)((ulong)*(uint *)((long)(allocator_00 + 2) + 0x48)
                                                  * (ulong)uVar7 >>
                                                 (*(byte *)((long)(allocator_00 + 2) + 0x4c) & 0x3f)
                                                 ) * *(int *)((long)(allocator_00 + 2) + 0x40)) * 8)
                ; puVar14 != (undefined8 *)0x0; puVar14 = (undefined8 *)*puVar14) {
              if ((*(uint *)(puVar14 + 6) == (uint)uVar11) &&
                 (*(uint *)((long)puVar14 + 0x14) == in_R9D)) {
                if (*(uint *)(puVar14 + 6) < 0xc) {
                  __s1 = (void *)((long)puVar14 + 0x34);
                }
                else {
                  __s1 = (void *)puVar14[7];
                }
                iVar8 = bcmp(__s1,name,uVar11);
                if (iVar8 == 0) {
                  return 0xf;
                }
              }
            }
            iVar8 = *(int *)((long)(allocator_00 + 2) + 0x18);
            if (iVar8 == -1) {
              EVar6 = 0xd;
            }
            else {
              allocator = (ZoneAllocator *)(allocator_00->_slots + 7);
              EVar6 = 0;
              if (*(int *)((long)(allocator_00 + 2) + 0x1c) == iVar8) {
                EVar6 = ZoneVectorBase::_grow
                                  ((ZoneVectorBase *)((long)(allocator_00 + 2) + 0x10),allocator,8,1
                                  );
              }
              if (EVar6 == 0) {
                if (allocator->_zone == (Zone *)0x0) {
                  newNamedLabelEntry();
                }
                else {
                  node = (ZoneHashNode *)ZoneAllocator::_allocZeroed(allocator,0x40,&sStack_60);
                  if (node != (ZoneHashNode *)0x0) {
                    *(uint *)&node[8].field_0x0 = uVar7;
                    *(int *)(node + 0xc) = iVar8;
                    node[0x10].field_0x0 = (char)in_R8D;
                    *(uint *)(node + 0x14) = in_R9D;
                    *(undefined8 *)&node[0x18].field_0x0 = 0;
                    this_00 = node + 0x30;
                    zone = (Zone *)(allocator_00->_slots + 3);
                    EVar6 = ZoneStringBase::setData((ZoneStringBase *)this_00,zone,0xb,name,uVar11);
                    if (EVar6 != 0) {
                      return EVar6;
                    }
                    if (*(uint *)((long)(allocator_00 + 2) + 0x18) <
                        *(uint *)((long)(allocator_00 + 2) + 0x1c)) {
                      *(ZoneHashNode **)
                       &(*(ZoneHashNode **)((long)(allocator_00 + 2) + 0x10))
                        [(ulong)*(uint *)((long)(allocator_00 + 2) + 0x18) * 8].field_0x0 = node;
                      *(int *)((long)(allocator_00 + 2) + 0x18) =
                           *(int *)((long)(allocator_00 + 2) + 0x18) + 1;
                      ZoneHashBase::_insert
                                ((ZoneHashBase *)((long)(allocator_00 + 2) + 0x30),allocator,node);
                      *puVar15 = node;
                      return 0;
                    }
                    newNamedLabelEntry();
                    puVar4 = zone->_ptr;
                    if (puVar4 == (uint8_t *)0x0) {
                      return 0;
                    }
                    if (puVar4 == (uint8_t *)0xffffffffffffffff) {
                      lVar5 = -1;
                      EVar6 = 0;
                      do {
                        EVar9 = EVar6;
                        lVar12 = lVar5;
                        ZVar2 = this_00[lVar12 + 1];
                        lVar5 = lVar12 + 1;
                        EVar6 = EVar9 * 0x1003f + (uint)(byte)ZVar2;
                      } while ((byte)ZVar2 != 0);
                      zone->_ptr = (uint8_t *)((lVar12 + 2) - (ulong)(ZVar2 == (ZoneHashNode)0x0));
                      return EVar9;
                    }
                    puVar13 = (uint8_t *)0x0;
                    EVar6 = 0;
                    do {
                      if (this_00[(long)puVar13] == (ZoneHashNode)0x0) {
                        return 0x11;
                      }
                      EVar6 = EVar6 * 0x1003f + (uint)(byte)this_00[(long)puVar13];
                      puVar13 = puVar13 + 1;
                    } while (puVar4 != puVar13);
                    return EVar6;
                  }
                }
                EVar6 = 1;
              }
            }
          }
          else {
            EVar6 = 0x10;
          }
          return EVar6;
        }
      }
      EVar6 = 1;
    }
  }
  return EVar6;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}